

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                    uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
                    uint8_t maxThreshold,SIMDType simdType)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint8_t *outY;
  uint simdWidth;
  SIMDType simdType_00;
  bool bVar4;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  uVar2 = height;
  uVar1 = width;
  simdType_00 = simdType;
  do {
    if (simdType_00 == cpu_function) break;
    uVar3 = getSimdSize(simdType_00);
    if (uVar3 <= uVar1) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,startYIn,out,startXOut,startYOut,uVar1,uVar2);
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
      Image_Function::
      VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,&local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&width,&height,in,&local_80);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
      uVar1 = out->_rowSize;
      uVar2 = in->_rowSize;
      simdWidth = width / uVar3;
      outY = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
      if (simdType_00 == sse_function) {
        sse::Threshold(uVar2,uVar1,in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2),outY,
                       outY + height * uVar1,minThreshold,maxThreshold,simdWidth,simdWidth * uVar3,
                       width % uVar3);
        return;
      }
      if (simdType_00 != avx_function) {
        return;
      }
      avx::Threshold(uVar2,uVar1,in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2),outY,
                     outY + height * uVar1,minThreshold,maxThreshold,simdWidth,simdWidth * uVar3,
                     width % uVar3);
      return;
    }
    bVar4 = simdType_00 == avx_function;
    simdType_00 = sse_function;
  } while (bVar4);
  Image_Function::Threshold
            (in,startXIn,startYIn,out,startXOut,startYOut,uVar1,uVar2,minThreshold,maxThreshold);
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            AVX_CODE( Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold, sse_function ); )

            Image_Function::Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }